

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall
QVariantAnimationPrivate::setCurrentValueForProgress(QVariantAnimationPrivate *this,qreal progress)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  QVariantAnimation *pQVar7;
  QVariantAnimationPrivate *in_RDI;
  QVariant *pQVar8;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  qreal localProgress;
  qreal endProgress;
  qreal startProgress;
  QVariantAnimation *q;
  QVariant ret;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  int in_stack_ffffffffffffff74;
  undefined4 local_78;
  QObjectPrivate *in_stack_ffffffffffffff98;
  QVariantAnimationPrivate *meta;
  char *signalName;
  QObjectPrivate *this_00;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  meta = in_RDI;
  pQVar7 = q_func(in_RDI);
  dVar1 = (in_RDI->currentInterval).start.first;
  dVar2 = (in_RDI->currentInterval).end.first;
  bVar4 = qIsNull((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) - dVar1);
  if (bVar4) {
    local_78 = 0;
  }
  else {
    local_78 = SUB84(((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) - dVar1) / (dVar2 - dVar1),0);
  }
  signalName = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QObjectPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  (*(pQVar7->super_QAbstractAnimation).super_QObject._vptr_QObject[0x11])
            (local_78,&stack0xffffffffffffffd8,pQVar7,&(in_RDI->currentInterval).start.second,
             &(in_RDI->currentInterval).end.second);
  pQVar8 = &in_RDI->currentValue;
  qSwap<QVariant>((QVariant *)
                  CONCAT44(in_stack_ffffffffffffff74,
                           CONCAT13(in_stack_ffffffffffffff73,
                                    CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70))),
                  (QVariant *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  (*(pQVar7->super_QAbstractAnimation).super_QObject._vptr_QObject[0x10])(pQVar7,pQVar8);
  iVar6 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x68e2a0);
  if (iVar6 == 0) {
    in_stack_ffffffffffffff74 = QObjectPrivate::signalIndex(this_00,signalName,(QMetaObject **)meta)
    ;
    QBasicAtomicInteger<int>::testAndSetRelaxed
              ((QBasicAtomicInteger<int> *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70))),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x68e301);
  uVar5 = QObjectPrivate::isSignalConnected
                    (in_stack_ffffffffffffff98,(uint)((ulong)in_RDI >> 0x20),
                     SUB81((ulong)in_RDI >> 0x18,0));
  if (((bool)uVar5) &&
     (in_stack_ffffffffffffff72 =
           ::operator!=((QVariant *)
                        CONCAT44(in_stack_ffffffffffffff74,
                                 CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffff72,
                                                         in_stack_ffffffffffffff70))),
                        (QVariant *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
     (bool)in_stack_ffffffffffffff72)) {
    QVariantAnimation::valueChanged
              ((QVariantAnimation *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)
                                )),
               (QVariant *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  ::QVariant::~QVariant
            ((QVariant *)
             CONCAT44(in_stack_ffffffffffffff74,
                      CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)))
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::setCurrentValueForProgress(const qreal progress)
{
    Q_Q(QVariantAnimation);

    const qreal startProgress = currentInterval.start.first;
    const qreal endProgress = currentInterval.end.first;
    const qreal localProgress =
            qIsNull(progress - startProgress) ? 0.0 // avoid 0/0 below
            /* else */                        : (progress - startProgress) / (endProgress - startProgress);

    QVariant ret = q->interpolated(currentInterval.start.second,
                                   currentInterval.end.second,
                                   localProgress);
    qSwap(currentValue, ret);
    q->updateCurrentValue(currentValue);
    Q_CONSTINIT static QBasicAtomicInt changedSignalIndex = Q_BASIC_ATOMIC_INITIALIZER(0);
    if (!changedSignalIndex.loadRelaxed()) {
        //we keep the mask so that we emit valueChanged only when needed (for performance reasons)
        changedSignalIndex.testAndSetRelaxed(0, signalIndex("valueChanged(QVariant)"));
    }
    if (isSignalConnected(changedSignalIndex.loadRelaxed()) && currentValue != ret) {
        //the value has changed
        emit q->valueChanged(currentValue);
    }
}